

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::TiledRgbaInputFile::readTile(TiledRgbaInputFile *this,int dx,int dy,int l)

{
  pthread_mutex_t *__mutex;
  lock_guard<std::mutex> lock;
  
  __mutex = (pthread_mutex_t *)this->_fromYa;
  if (__mutex != (pthread_mutex_t *)0x0) {
    std::mutex::lock((mutex *)&__mutex->__data);
    FromYa::readTile(this->_fromYa,dx,dy,l,l);
    pthread_mutex_unlock(__mutex);
    return;
  }
  TiledInputFile::readTile(this->_inputFile,dx,dy,l);
  return;
}

Assistant:

void
TiledRgbaInputFile::readTile (int dx, int dy, int l)
{
    if (_fromYa)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_fromYa);
#endif
        _fromYa->readTile (dx, dy, l, l);
    }
    else { _inputFile->readTile (dx, dy, l); }
}